

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O0

DisasJumpType op_vlbb(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  int iVar1;
  int iVar2;
  int iVar3;
  TCGv_i64 ret;
  TCGv_ptr r;
  TCGv_i64 bytes;
  TCGv_ptr a0;
  int v1_offs;
  int64_t block_size;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = get_field1(s,FLD_O_m3,FLD_C_i3);
  iVar2 = get_field1(s,FLD_O_v1,FLD_C_b1);
  iVar2 = vec_full_reg_offset((uint8_t)iVar2);
  iVar3 = get_field1(s,FLD_O_m3,FLD_C_i3);
  if (iVar3 < 7) {
    ret = tcg_temp_new_i64(tcg_ctx_00);
    r = tcg_temp_new_ptr(tcg_ctx_00);
    tcg_gen_ori_i64_s390x(tcg_ctx_00,ret,o->addr1,-(1L << ((char)iVar1 + 6U & 0x3f)));
    tcg_gen_neg_i64(tcg_ctx_00,ret,ret);
    tcg_gen_addi_ptr(tcg_ctx_00,r,tcg_ctx_00->cpu_env,(long)iVar2);
    gen_helper_vll(tcg_ctx_00,tcg_ctx_00->cpu_env,r,o->addr1,ret);
    tcg_temp_free_i64(tcg_ctx_00,ret);
    tcg_temp_free_ptr(tcg_ctx_00,r);
    s_local._4_4_ = DISAS_NEXT;
  }
  else {
    gen_program_exception(s,6);
    s_local._4_4_ = DISAS_NORETURN;
  }
  return s_local._4_4_;
}

Assistant:

static DisasJumpType op_vlbb(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const int64_t block_size = (1ull << (get_field(s, m3) + 6));
    const int v1_offs = vec_full_reg_offset(get_field(s, v1));
    TCGv_ptr a0;
    TCGv_i64 bytes;

    if (get_field(s, m3) > 6) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    bytes = tcg_temp_new_i64(tcg_ctx);
    a0 = tcg_temp_new_ptr(tcg_ctx);
    /* calculate the number of bytes until the next block boundary */
    tcg_gen_ori_i64(tcg_ctx, bytes, o->addr1, -block_size);
    tcg_gen_neg_i64(tcg_ctx, bytes, bytes);

    tcg_gen_addi_ptr(tcg_ctx, a0, tcg_ctx->cpu_env, v1_offs);
    gen_helper_vll(tcg_ctx, tcg_ctx->cpu_env, a0, o->addr1, bytes);
    tcg_temp_free_i64(tcg_ctx, bytes);
    tcg_temp_free_ptr(tcg_ctx, a0);
    return DISAS_NEXT;
}